

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compare.h
# Opt level: O0

bool Gs::Compare<float,3ul>(Vector<float,_3UL> *lhs,Vector<float,_3UL> *rhs)

{
  float fVar1;
  float *pfVar2;
  ulong local_28;
  size_t i;
  Vector<float,_3UL> *rhs_local;
  Vector<float,_3UL> *lhs_local;
  
  local_28 = 0;
  while( true ) {
    if (2 < local_28) {
      return false;
    }
    pfVar2 = Vector<float,_3UL>::operator[](lhs,local_28);
    fVar1 = *pfVar2;
    pfVar2 = Vector<float,_3UL>::operator[](rhs,local_28);
    if (fVar1 < *pfVar2) break;
    pfVar2 = Vector<float,_3UL>::operator[](lhs,local_28);
    fVar1 = *pfVar2;
    pfVar2 = Vector<float,_3UL>::operator[](rhs,local_28);
    if (*pfVar2 <= fVar1 && fVar1 != *pfVar2) {
      return false;
    }
    local_28 = local_28 + 1;
  }
  return true;
}

Assistant:

bool Compare(const Vector<T, N>& lhs, const Vector<T, N>& rhs)
{
    for (std::size_t i = 0; i < N; ++i)
    {
        if (lhs[i] < rhs[i])
            return true;
        if (lhs[i] > rhs[i])
            return false;
    }
    return false;
}